

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int get_var(char *data,size_t data_len,char *name,char *dst,size_t dst_len)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  size_t len;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  char *src;
  
  iVar2 = -2;
  if (dst_len != 0 && dst != (char *)0x0) {
    if (((data_len == 0) || (data == (char *)0x0)) || (name == (char *)0x0)) {
      *dst = '\0';
    }
    else {
      len = strlen(name);
      *dst = '\0';
      if ((long)data_len <= (long)len) {
        return -1;
      }
      lVar5 = 0;
      do {
        if (((lVar5 == 0) || (data[lVar5 + -1] == '&')) &&
           ((data[lVar5 + len] == '=' && (iVar2 = mg_strncasecmp(name,data + lVar5,len), iVar2 == 0)
            ))) {
          src = data + lVar5 + len + 1;
          pcVar4 = (char *)memchr(src,0x26,(~len + data_len) - lVar5);
          pcVar6 = data + data_len;
          if (pcVar4 != (char *)0x0) {
            pcVar6 = pcVar4;
          }
          if (src <= pcVar6) {
            uVar3 = mg_url_decode(src,((int)pcVar6 + ~((int)data + (int)len)) - (int)lVar5,dst,
                                  (int)dst_len,1);
            if (uVar3 < 0xfffffffe) {
              return uVar3;
            }
            return -2;
          }
          __assert_fail("s >= p",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ProjetoHotSpot[P]UaiFai/lib/mongoose.c"
                        ,0x12f5,"int get_var(const char *, size_t, const char *, char *, size_t)");
        }
        lVar1 = lVar5 + len;
        lVar5 = lVar5 + 1;
      } while (data + lVar1 + 1 < data + data_len);
    }
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int get_var(const char *data, size_t data_len, const char *name,
                   char *dst, size_t dst_len) {
  const char *p, *e, *s;
  size_t name_len;
  int len;

  if (dst == NULL || dst_len == 0) {
    len = -2;
  } else if (data == NULL || name == NULL || data_len == 0) {
    len = -1;
    dst[0] = '\0';
  } else {
    name_len = strlen(name);
    e = data + data_len;
    len = -1;
    dst[0] = '\0';

    // data is "var1=val1&var2=val2...". Find variable first
    for (p = data; p + name_len < e; p++) {
      if ((p == data || p[-1] == '&') && p[name_len] == '=' &&
          !mg_strncasecmp(name, p, name_len)) {

        // Point p to variable value
        p += name_len + 1;

        // Point s to the end of the value
        s = (const char *) memchr(p, '&', (size_t)(e - p));
        if (s == NULL) {
          s = e;
        }
        assert(s >= p);

        // Decode variable into destination buffer
        len = mg_url_decode(p, (size_t)(s - p), dst, dst_len, 1);

        // Redirect error code from -1 to -2 (destination buffer too small).
        if (len == -1) {
          len = -2;
        }
        break;
      }
    }
  }

  return len;
}